

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cc_helper.c
# Opt level: O2

target_ulong helper_cc_compute_c_x86_64(target_ulong dst,target_ulong src1,target_ulong src2,int op)

{
  short sVar1;
  ushort uVar2;
  target_ulong tVar3;
  byte bVar4;
  byte bVar7;
  bool bVar9;
  bool bVar10;
  bool bVar11;
  ushort uVar5;
  uint uVar6;
  uint uVar8;
  
  tVar3 = 0;
  bVar4 = (byte)src1;
  uVar5 = (ushort)src1;
  uVar6 = (uint)src1;
  bVar7 = (byte)dst;
  uVar2 = (ushort)dst;
  uVar8 = (uint)dst;
  sVar1 = (short)src2;
  switch(op) {
  case 1:
  case 0x26:
  case 0x27:
  case 0x28:
  case 0x29:
  case 0x2f:
    goto switchD_004c65b9_caseD_1;
  case 2:
  case 3:
  case 4:
  case 5:
    return (ulong)(src1 != 0);
  case 6:
    bVar11 = bVar7 < bVar4;
    break;
  case 7:
    bVar11 = uVar2 < uVar5;
    break;
  case 8:
    bVar11 = uVar8 < uVar6;
    break;
  case 9:
    bVar11 = dst < src1;
    break;
  case 0xb:
    bVar9 = uVar2 < uVar5;
    bVar11 = uVar2 <= uVar5;
    bVar10 = sVar1 == 0;
    goto LAB_004c6684;
  case 0xe:
    bVar11 = CARRY1(bVar4,bVar7);
    break;
  case 0xf:
    bVar11 = CARRY2(uVar5,uVar2);
    break;
  case 0x10:
    bVar11 = CARRY4(uVar6,uVar8);
    break;
  case 0x11:
    bVar11 = CARRY8(src1,dst);
    break;
  case 0x12:
    dst = (target_ulong)(byte)(bVar7 + bVar4 + (char)src2);
  case 10:
    bVar9 = (byte)dst < bVar4;
    bVar11 = (byte)dst <= bVar4;
    bVar10 = (char)src2 == '\0';
    goto LAB_004c6684;
  case 0x13:
    uVar2 = uVar5 + uVar2 + sVar1;
    bVar11 = uVar2 <= uVar5;
    if (sVar1 == 0) {
      bVar11 = uVar2 < uVar5;
    }
    return (ulong)bVar11;
  case 0x14:
    dst = (target_ulong)(uVar8 + uVar6 + (int)src2);
  case 0xc:
    bVar9 = (uint)dst < uVar6;
    bVar11 = (uint)dst <= uVar6;
    bVar10 = (int)src2 == 0;
    goto LAB_004c6684;
  case 0x15:
    dst = dst + src1 + src2;
  case 0xd:
    bVar9 = dst < src1;
    bVar11 = dst <= src1;
    bVar10 = src2 == 0;
LAB_004c6684:
    if (bVar10) {
      bVar11 = bVar9;
    }
    return (ulong)bVar11;
  default:
    goto switchD_004c65b9_caseD_16;
  case 0x1a:
  case 0x1b:
  case 0x1c:
  case 0x1d:
  case 0x1e:
  case 0x1f:
  case 0x20:
  case 0x21:
    goto switchD_004c65b9_caseD_1a;
  case 0x22:
    src1 = (target_ulong)(uVar6 >> 7);
    goto switchD_004c65b9_caseD_1;
  case 0x23:
    src1 = (target_ulong)(uVar6 >> 0xf);
switchD_004c65b9_caseD_1:
    src1 = (target_ulong)((uint)src1 & 1);
switchD_004c65b9_caseD_1a:
    return src1;
  case 0x24:
    return (ulong)(uVar6 >> 0x1f);
  case 0x25:
    return src1 >> 0x3f;
  case 0x2a:
    bVar11 = bVar4 == 0;
    goto LAB_004c6690;
  case 0x2b:
    bVar11 = uVar5 == 0;
    goto LAB_004c6690;
  case 0x2c:
    bVar11 = uVar6 == 0;
    goto LAB_004c6690;
  case 0x2d:
    bVar11 = src1 == 0;
LAB_004c6690:
    tVar3 = (target_ulong)bVar11;
switchD_004c65b9_caseD_16:
    return tVar3;
  case 0x2e:
  case 0x30:
    return dst;
  }
  return (ulong)bVar11;
}

Assistant:

target_ulong helper_cc_compute_c(target_ulong dst, target_ulong src1,
                                 target_ulong src2, int op)
{
    switch (op) {
    default: /* should never happen */
    case CC_OP_LOGICB:
    case CC_OP_LOGICW:
    case CC_OP_LOGICL:
    case CC_OP_LOGICQ:
    case CC_OP_CLR:
    case CC_OP_POPCNT:
        return 0;

    case CC_OP_EFLAGS:
    case CC_OP_SARB:
    case CC_OP_SARW:
    case CC_OP_SARL:
    case CC_OP_SARQ:
    case CC_OP_ADOX:
        return src1 & 1;

    case CC_OP_INCB:
    case CC_OP_INCW:
    case CC_OP_INCL:
    case CC_OP_INCQ:
    case CC_OP_DECB:
    case CC_OP_DECW:
    case CC_OP_DECL:
    case CC_OP_DECQ:
        return src1;

    case CC_OP_MULB:
    case CC_OP_MULW:
    case CC_OP_MULL:
    case CC_OP_MULQ:
        return src1 != 0;

    case CC_OP_ADCX:
    case CC_OP_ADCOX:
        return dst;

    case CC_OP_ADDB:
        return compute_c_addb(dst, src1);
    case CC_OP_ADDW:
        return compute_c_addw(dst, src1);
    case CC_OP_ADDL:
        return compute_c_addl(dst, src1);

    case CC_OP_ADCB:
        return compute_c_adcb(dst, src1, src2);
    case CC_OP_ADCW:
        return compute_c_adcw(dst, src1, src2);
    case CC_OP_ADCL:
        return compute_c_adcl(dst, src1, src2);

    case CC_OP_SUBB:
        return compute_c_subb(dst, src1);
    case CC_OP_SUBW:
        return compute_c_subw(dst, src1);
    case CC_OP_SUBL:
        return compute_c_subl(dst, src1);

    case CC_OP_SBBB:
        return compute_c_sbbb(dst, src1, src2);
    case CC_OP_SBBW:
        return compute_c_sbbw(dst, src1, src2);
    case CC_OP_SBBL:
        return compute_c_sbbl(dst, src1, src2);

    case CC_OP_SHLB:
        return compute_c_shlb(dst, src1);
    case CC_OP_SHLW:
        return compute_c_shlw(dst, src1);
    case CC_OP_SHLL:
        return compute_c_shll(dst, src1);

    case CC_OP_BMILGB:
        return compute_c_bmilgb(dst, src1);
    case CC_OP_BMILGW:
        return compute_c_bmilgw(dst, src1);
    case CC_OP_BMILGL:
        return compute_c_bmilgl(dst, src1);

#ifdef TARGET_X86_64
    case CC_OP_ADDQ:
        return compute_c_addq(dst, src1);
    case CC_OP_ADCQ:
        return compute_c_adcq(dst, src1, src2);
    case CC_OP_SUBQ:
        return compute_c_subq(dst, src1);
    case CC_OP_SBBQ:
        return compute_c_sbbq(dst, src1, src2);
    case CC_OP_SHLQ:
        return compute_c_shlq(dst, src1);
    case CC_OP_BMILGQ:
        return compute_c_bmilgq(dst, src1);
#endif
    }
}